

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O2

uint __thiscall llvm::ARM::parseHWDiv(ARM *this,StringRef HWDiv)

{
  int iVar1;
  StringRef *pSVar2;
  char *__n;
  long lVar3;
  char *local_40;
  char local_38 [8];
  bool local_30;
  
  __n = HWDiv.Data;
  if (__n == (char *)0x9) {
    __n = (char *)0x9;
    iVar1 = bcmp(this,"thumb,arm",9);
    if (iVar1 == 0) {
      local_40 = "arm,thumb";
      local_38[0] = '\t';
      local_38[1] = '\0';
      local_38[2] = '\0';
      local_38[3] = '\0';
      local_38[4] = '\0';
      local_38[5] = '\0';
      local_38[6] = '\0';
      local_38[7] = '\0';
      local_30 = true;
      pSVar2 = Optional<llvm::StringRef>::getPointer((Optional<llvm::StringRef> *)&local_40);
      this = (ARM *)pSVar2->Data;
      __n = (char *)pSVar2->Length;
    }
  }
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 0x78) {
      return 0;
    }
    if ((__n == *(char **)((long)&DAT_001f62c8 + lVar3)) &&
       ((__n == (char *)0x0 ||
        (iVar1 = bcmp(this,*(void **)((long)&(anonymous_namespace)::HWDivNames + lVar3),(size_t)__n)
        , iVar1 == 0)))) break;
    lVar3 = lVar3 + 0x18;
  }
  return *(uint *)((long)&DAT_001f62d0 + lVar3);
}

Assistant:

unsigned llvm::ARM::parseHWDiv(StringRef HWDiv) {
  StringRef Syn = getHWDivSynonym(HWDiv);
  for (const auto D : HWDivNames) {
    if (Syn == D.getName())
      return D.ID;
  }
  return ARM::AEK_INVALID;
}